

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_cv_posix.cpp
# Opt level: O1

void __thiscall
pstore::descriptor_condition_variable::descriptor_condition_variable
          (descriptor_condition_variable *this)

{
  int iVar1;
  int *piVar2;
  pipe_descriptor *this_00;
  char *str;
  int fds_ [2];
  value_type local_28 [2];
  
  this->_vptr_descriptor_condition_variable =
       (_func_int **)&PTR__descriptor_condition_variable_0019a1e8;
  (this->read_fd_).fd_ = -1;
  (this->write_fd_).fd_ = -1;
  this_00 = &this->write_fd_;
  local_28[0] = 0;
  local_28[1] = 0;
  iVar1 = pipe(local_28);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    raise<pstore::errno_erc,char[5]>((errno_erc)*piVar2,(char (*) [5])0x1742a3);
  }
  details::descriptor<pstore::details::posix_descriptor_traits>::reset(&this->read_fd_,local_28[0]);
  details::descriptor<pstore::details::posix_descriptor_traits>::reset(this_00,local_28[1]);
  iVar1 = (this->read_fd_).fd_;
  if (iVar1 < 0) {
    iVar1 = 0x38;
    str = "read_fd_.valid ()";
  }
  else {
    if (-1 < this_00->fd_) {
      make_non_blocking(iVar1);
      make_non_blocking(this_00->fd_);
      return;
    }
    iVar1 = 0x39;
    str = "write_fd_.valid ()";
  }
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/signal_cv_posix.cpp"
                ,iVar1);
}

Assistant:

descriptor_condition_variable::descriptor_condition_variable () {
        enum { read_index, write_index, last_index };
        int fds_[last_index] = {0};
        if (::pipe (&fds_[0]) == -1) {
            raise (errno_erc{errno}, "pipe");
        }

        read_fd_.reset (fds_[read_index]);
        write_fd_.reset (fds_[write_index]);
        PSTORE_ASSERT (read_fd_.valid ());
        PSTORE_ASSERT (write_fd_.valid ());

        // Make both pipe descriptors non-blocking.
        descriptor_condition_variable::make_non_blocking (read_fd_.native_handle ());
        descriptor_condition_variable::make_non_blocking (write_fd_.native_handle ());
    }